

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O3

int phr_parse_request(char *buf_start,size_t len,char **method,size_t *method_len,char **path,
                     size_t *path_len,int *minor_version,phr_header *headers,size_t *num_headers,
                     size_t last_len)

{
  byte *buf_end;
  long lVar1;
  int iVar2;
  char *tok_start;
  byte *pbVar3;
  char *pcVar4;
  byte bVar5;
  size_t sVar6;
  int iVar7;
  byte *buf;
  byte *pbVar8;
  int local_3c;
  size_t local_38;
  
  buf_end = (byte *)(buf_start + len);
  local_38 = *num_headers;
  iVar7 = 0;
  *method = (char *)0x0;
  *method_len = 0;
  *path = (char *)0x0;
  *path_len = 0;
  *minor_version = -1;
  *num_headers = 0;
  if (last_len != 0) {
    pbVar3 = (byte *)(buf_start + (last_len - 3));
    if (last_len < 3) {
      pbVar3 = (byte *)buf_start;
    }
    do {
      if (pbVar3 == buf_end) {
        return -2;
      }
      pbVar8 = pbVar3 + 1;
      if (*pbVar3 == 10) {
LAB_00115d6d:
        iVar2 = iVar7 + 1;
      }
      else {
        iVar2 = 0;
        if (*pbVar3 == 0xd) {
          if (pbVar8 == buf_end) {
            return -2;
          }
          if (*pbVar8 != 10) {
            return -1;
          }
          pbVar8 = pbVar3 + 2;
          goto LAB_00115d6d;
        }
      }
      iVar7 = iVar2;
      pbVar3 = pbVar8;
    } while (iVar7 != 2);
  }
  if (len != 0) {
    if (*buf_start == '\n') {
      pbVar3 = (byte *)(buf_start + 1);
    }
    else {
      pbVar3 = (byte *)buf_start;
      if (*buf_start == '\r') {
        if (len == 1) {
          return -2;
        }
        if (buf_start[1] != '\n') {
          return -1;
        }
        pbVar3 = (byte *)(buf_start + 2);
      }
    }
    if (pbVar3 != buf_end) {
      sVar6 = 0;
      while (bVar5 = pbVar3[sVar6], bVar5 != 0x20) {
        if (bVar5 - 0x7f < 0xffffffa1) {
          if (bVar5 < 0x20) {
            return -1;
          }
          if (bVar5 == 0x7f) {
            return -1;
          }
        }
        lVar1 = sVar6 + 1;
        sVar6 = sVar6 + 1;
        if (pbVar3 + lVar1 == buf_end) {
          return -2;
        }
      }
      *method = (char *)pbVar3;
      *method_len = sVar6;
      pbVar3 = pbVar3 + sVar6 + 1;
      do {
        pbVar8 = pbVar3;
        bVar5 = *pbVar8;
        pbVar3 = pbVar8 + 1;
      } while (bVar5 == 0x20);
      if (pbVar8 == buf_end) {
        return -2;
      }
      sVar6 = 0;
      do {
        buf = pbVar3;
        if (bVar5 - 0x7f < 0xffffffa1) {
          if (bVar5 < 0x20) {
            return -1;
          }
          if (bVar5 == 0x7f) {
            return -1;
          }
        }
        if (buf == buf_end) {
          return -2;
        }
        bVar5 = *buf;
        sVar6 = sVar6 + 1;
        pbVar3 = buf + 1;
      } while (bVar5 != 0x20);
      *path = (char *)pbVar8;
      *path_len = sVar6;
      do {
        pbVar3 = buf + 1;
        buf = buf + 1;
      } while (*pbVar3 == 0x20);
      if (*method_len != 0) {
        pcVar4 = parse_http_version((char *)buf,(char *)buf_end,minor_version,&local_3c);
        if (pcVar4 == (char *)0x0) {
          return local_3c;
        }
        if (*pcVar4 == '\n') {
          pcVar4 = pcVar4 + 1;
LAB_00115ed4:
          pcVar4 = parse_headers(pcVar4,(char *)buf_end,headers,num_headers,local_38,&local_3c);
          if (pcVar4 != (char *)0x0) {
            return (int)pcVar4 - (int)buf_start;
          }
          return local_3c;
        }
        if (*pcVar4 == '\r') {
          if ((byte *)(pcVar4 + 1) == buf_end) {
            return -2;
          }
          if (pcVar4[1] == '\n') {
            pcVar4 = pcVar4 + 2;
            goto LAB_00115ed4;
          }
        }
      }
      return -1;
    }
  }
  return -2;
}

Assistant:

int phr_parse_request(const char *buf_start, size_t len, const char **method,
					  size_t *method_len, const char **path, size_t *path_len,
					  int *minor_version, struct phr_header *headers,
					  size_t *num_headers, size_t last_len)
{
	const char *buf = buf_start, *buf_end = buf_start + len;
	size_t max_headers = *num_headers;
	int r;

	*method = NULL;
	*method_len = 0;
	*path = NULL;
	*path_len = 0;
	*minor_version = -1;
	*num_headers = 0;

	/* if last_len != 0, check if the request is complete (a fast countermeasure
	   againt slowloris */
	if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
		return r;
	}

	if ((buf = parse_request(buf, buf_end, method, method_len, path, path_len,
							 minor_version, headers, num_headers, max_headers,
							 &r)) == NULL) {
		return r;
	}

	return (int)(buf - buf_start);
}